

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_exeWatcher.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  int iVar1;
  string file_name;
  exeWatcher ew;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  undefined8 uStack_b0;
  string local_a8;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  exeWatcher local_68;
  
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  iVar1 = 1;
  if (argc == 2) {
    __s = argv[1];
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_a8,0,(char *)0x0,(ulong)__s);
    local_c8 = &local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,local_a8._M_dataplus._M_p,
               local_a8._M_dataplus._M_p + local_a8._M_string_length);
    local_78 = (code *)0x0;
    pcStack_70 = (code *)0x0;
    local_88._M_unused._M_object = (void *)0x0;
    local_88._8_8_ = 0;
    local_88._M_unused._M_object = operator_new(0x20);
    *(code **)local_88._M_unused._0_8_ = (code *)((long)local_88._M_unused._0_8_ + 0x10);
    if (local_c8 == &local_b8) {
      *(ulong *)((long)local_88._M_unused._0_8_ + 0x10) = CONCAT71(uStack_b7,local_b8);
      *(undefined8 *)((long)local_88._M_unused._0_8_ + 0x18) = uStack_b0;
    }
    else {
      *(undefined1 **)local_88._M_unused._0_8_ = local_c8;
      *(ulong *)((long)local_88._M_unused._0_8_ + 0x10) = CONCAT71(uStack_b7,local_b8);
    }
    *(undefined8 *)((long)local_88._M_unused._0_8_ + 8) = local_c0;
    local_c0 = 0;
    local_b8 = 0;
    pcStack_70 = std::
                 _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/test/example_exeWatcher.cpp:11:48)>
                 ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/test/example_exeWatcher.cpp:11:48)>
               ::_M_manager;
    local_c8 = &local_b8;
    wmj::fileWatcher::exeWatcher::exeWatcher(&local_68,&local_a8,(function<void_(bool)> *)&local_88)
    ;
    if (local_78 != (code *)0x0) {
      (*local_78)(&local_88,&local_88,__destroy_functor);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
    }
    wmj::fileWatcher::exeWatcher::startWatch(&local_68);
    wmj::fileWatcher::exeWatcher::run(&local_68);
    wmj::fileWatcher::exeWatcher::~exeWatcher(&local_68);
    iVar1 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,
                      CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                               local_a8.field_2._M_local_buf[0]) + 1);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int main(int argc, char **argv) {
    std::string file_name;
    if(argc == 2) {
        file_name = argv[1];
    } else {
        return 1;
    }
    wmj::fileWatcher::exeWatcher ew(file_name, [file_name](bool if_open) {
        if(if_open) {
            std::cout << file_name << " launched" << std::endl;
        } else {
            std::cout << file_name << " close" << std::endl;
        }
    });
    ew.startWatch();
    ew.run();
    return 0;
}